

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>
::dx(FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>
     *this,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Fad<double> *pFVar5;
  FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_> *this_00;
  double *pdVar6;
  value_type vVar7;
  
  pFVar5 = this->left_;
  pdVar6 = &pFVar5->defaultVal;
  if ((pFVar5->dx_).num_elts != 0) {
    pdVar6 = (pFVar5->dx_).ptr_to_data + i;
  }
  this_00 = &this->right_->fadexpr_;
  dVar1 = ((this_00->left_->fadexpr_).left_)->val_;
  dVar2 = ((this_00->left_->fadexpr_).right_)->val_;
  dVar3 = this_00->right_->val_;
  dVar4 = *pdVar6;
  vVar7 = FadBinaryAdd<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>::dx
                    (this_00,i);
  return vVar7 * this->left_->val_ + (dVar1 * dVar2 + dVar3) * dVar4;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}